

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::
TypedExpectation<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::ShouldHandleArguments
          (TypedExpectation<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone((ExpectationBase *)this);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this[0x84] ==
      (TypedExpectation<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
       )0x0) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    if (bVar1) {
      bVar1 = Matches(this,args);
      return bVar1;
    }
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }